

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::generate_service(t_xml_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  t_program *ptVar3;
  reference pcVar4;
  undefined4 extraout_var_00;
  t_service *ptVar5;
  string *psVar6;
  undefined4 extraout_var_01;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  t_function **local_238;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_230;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_228;
  iterator fn_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  allocator local_1e1;
  string local_1e0;
  string local_1c0;
  allocator local_199;
  string local_198;
  t_service *local_178;
  t_service *extends;
  allocator local_149;
  string local_148;
  string local_128;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [8];
  string tns;
  undefined1 local_b8 [8];
  string prog_ns;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  t_service *local_18;
  t_service *tservice_local;
  t_xml_generator *this_local;
  
  local_18 = tservice;
  tservice_local = (t_service *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"service",&local_39);
  write_element_start(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string
            ((string *)(prog_ns.field_2._M_local_buf + 8),(string *)CONCAT44(extraout_var,iVar2));
  write_attribute(this,&local_70,(string *)((long)&prog_ns.field_2 + 8));
  std::__cxx11::string::~string((string *)(prog_ns.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if ((this->should_use_namespaces_ & 1U) != 0) {
    ptVar3 = t_type::get_program(&local_18->super_t_type);
    target_namespace_abi_cxx11_((string *)local_b8,this,ptVar3);
    std::__cxx11::string::rbegin();
    pcVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&tns.field_2 + 8));
    if (*pcVar4 != '/') {
      std::__cxx11::string::push_back((char)local_b8);
    }
    iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"targetNamespace",&local_101);
    std::__cxx11::string::string((string *)&local_128,(string *)local_e0);
    write_attribute(this,&local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"xmlns:tns",&local_149);
    std::__cxx11::string::string((string *)&extends,(string *)local_e0);
    write_attribute(this,&local_148,(string *)&extends);
    std::__cxx11::string::~string((string *)&extends);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_b8);
  }
  ptVar5 = t_service::get_extends(local_18);
  if (ptVar5 != (t_service *)0x0) {
    local_178 = t_service::get_extends(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"parent-module",&local_199);
    ptVar3 = t_type::get_program(&local_178->super_t_type);
    psVar6 = t_program::get_name_abi_cxx11_(ptVar3);
    std::__cxx11::string::string((string *)&local_1c0,(string *)psVar6);
    write_attribute(this,&local_198,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"parent-id",&local_1e1);
    iVar2 = (*(local_178->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)CONCAT44(extraout_var_01,iVar2))
    ;
    write_attribute(this,&local_1e0,
                    (string *)
                    &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  write_doc(this,(t_doc *)local_18);
  __x = t_service::get_functions(local_18);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter,__x);
  local_228._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  while( true ) {
    local_230._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
    bVar1 = __gnu_cxx::operator!=(&local_228,&local_230);
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_228);
    generate_function(this,*pptVar7);
    local_238 = (t_function **)
                __gnu_cxx::
                __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator++(&local_228,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_268,&(local_18->super_t_type).annotations_);
  generate_annotations(this,&local_268);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_268);
  write_element_end(this);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&fn_iter);
  return;
}

Assistant:

void t_xml_generator::generate_service(t_service* tservice) {

  write_element_start("service");
  write_attribute("name", tservice->get_name());

  if (should_use_namespaces_) {
    string prog_ns = target_namespace(tservice->get_program());
    if (*prog_ns.rbegin() != '/') {
      prog_ns.push_back('/');
    }
    const string tns = prog_ns + tservice->get_name();
    write_attribute("targetNamespace", tns);
    write_attribute("xmlns:tns", tns);
  }

  if (tservice->get_extends()) {
    const t_service* extends = tservice->get_extends();
    write_attribute("parent-module", extends->get_program()->get_name());
    write_attribute("parent-id", extends->get_name());
  }

  write_doc(tservice);

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    generate_function(*fn_iter);
  }

  generate_annotations(tservice->annotations_);

  write_element_end();

}